

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O0

void build_score(high_score *entry,player *p,char *died_from,time_t *death_time)

{
  long lVar1;
  tm *__tp;
  time_t *death_time_local;
  char *died_from_local;
  player *p_local;
  high_score *entry_local;
  
  memset(entry,0,0x7e);
  strnfmt(entry->what,8,"%s",buildid);
  lVar1 = total_points(p);
  strnfmt(entry->pts,10,"%9ld",lVar1);
  strnfmt(entry->gold,10,"%9ld",(long)p->au);
  strnfmt(entry->turns,10,"%9ld",(long)turn);
  if (death_time == (time_t *)0x0) {
    my_strcpy(entry->day,"TODAY",10);
  }
  else {
    __tp = localtime(death_time);
    strftime(entry->day,10,"@%Y%m%d",__tp);
  }
  strnfmt(entry->who,0x10,"%-.15s",p->full_name);
  strnfmt(entry->uid,8,"%7u",(ulong)(uint)player_uid);
  strnfmt(entry->p_r,3,"%2d",(ulong)p->race->ridx);
  strnfmt(entry->p_c,3,"%2d",(ulong)p->class->cidx);
  strnfmt(entry->cur_lev,4,"%3d",(ulong)(uint)(int)p->lev);
  strnfmt(entry->cur_dun,4,"%3d",(ulong)(uint)(int)p->depth);
  strnfmt(entry->max_lev,4,"%3d",(ulong)(uint)(int)p->max_lev);
  strnfmt(entry->max_dun,4,"%3d",(ulong)(uint)(int)p->max_depth);
  my_strcpy(entry->how,died_from,0x20);
  return;
}

Assistant:

void build_score(struct high_score *entry, const struct player *p,
		const char *died_from, const time_t *death_time)
{
	memset(entry, 0, sizeof(struct high_score));

	/* Save the version */
	strnfmt(entry->what, sizeof(entry->what), "%s", buildid);

	/* Calculate and save the points */
	strnfmt(entry->pts, sizeof(entry->pts), "%9ld", total_points(p));

	/* Save the current gold */
	strnfmt(entry->gold, sizeof(entry->gold), "%9ld", (long)p->au);

	/* Save the current turn */
	strnfmt(entry->turns, sizeof(entry->turns), "%9ld", (long)turn);

	/* Time of death */
	if (death_time)
		strftime(entry->day, sizeof(entry->day), "@%Y%m%d",
				 localtime(death_time));
	else
		my_strcpy(entry->day, "TODAY", sizeof(entry->day));

	/* Save the player name (15 chars) */
	strnfmt(entry->who, sizeof(entry->who), "%-.15s", p->full_name);

	/* Save the player info XXX XXX XXX */
	strnfmt(entry->uid, sizeof(entry->uid), "%7u", player_uid);
	strnfmt(entry->p_r, sizeof(entry->p_r), "%2d", p->race->ridx);
	strnfmt(entry->p_c, sizeof(entry->p_c), "%2d", p->class->cidx);

	/* Save the level and such */
	strnfmt(entry->cur_lev, sizeof(entry->cur_lev), "%3d", p->lev);
	strnfmt(entry->cur_dun, sizeof(entry->cur_dun), "%3d", p->depth);
	strnfmt(entry->max_lev, sizeof(entry->max_lev), "%3d", p->max_lev);
	strnfmt(entry->max_dun, sizeof(entry->max_dun), "%3d", p->max_depth);

	/* No cause of death */
	my_strcpy(entry->how, died_from, sizeof(entry->how));
}